

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountDownLatch.cpp
# Opt level: O0

__pid_t __thiscall CountDownLatch::wait(CountDownLatch *this,void *__stat_loc)

{
  __pid_t extraout_EAX;
  MutexLock *_mutex;
  MutexLockGuard local_18;
  MutexLockGuard lock;
  CountDownLatch *this_local;
  
  _mutex = &this->mutex_;
  lock.mutex = (MutexLock *)this;
  MutexLockGuard::MutexLockGuard(&local_18,_mutex);
  while (0 < this->count_) {
    Condition::wait(&this->condition_,_mutex);
  }
  MutexLockGuard::~MutexLockGuard(&local_18);
  return extraout_EAX;
}

Assistant:

void CountDownLatch::wait() {
  MutexLockGuard lock(mutex_);
  while (count_ > 0) condition_.wait();
}